

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QIconEngine *engine)

{
  QString *t;
  ulong uVar1;
  long *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff78;
  QDebug *in_stack_ffffffffffffff80;
  Stream *this;
  undefined1 local_40 [8];
  char *in_stack_ffffffffffffffc8;
  undefined1 local_28 [24];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  if (in_RDX == (long *)0x0) {
    QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffc8);
  }
  else {
    t = (QString *)QDebug::noquote(in_RSI);
    (**(code **)(*in_RDX + 0x38))(local_28);
    QDebug::operator<<((QDebug *)in_RDI,t);
    QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffc8);
    QString::~QString((QString *)0x2a1ee0);
    QDebug::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    uVar1 = (**(code **)(*in_RDX + 0x68))();
    if ((uVar1 & 1) == 0) {
      QDebug::quote(in_RSI);
      in_stack_ffffffffffffff80 = QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffc8);
      (**(code **)(*in_RDX + 0x60))(local_40);
      QDebug::operator<<((QDebug *)in_RDI,t);
      QString::~QString((QString *)0x2a1f45);
    }
    else {
      QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffc8);
    }
    QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffc8);
  }
  QDebug::QDebug(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QIconEngine *engine)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (engine) {
        debug.noquote() << engine->key() << "(";
        debug << static_cast<const void *>(engine);
        if (!engine->isNull())
            debug.quote() << ", " << engine->iconName();
        else
            debug << ", null";
        debug << ")";
    } else {
        debug << "QIconEngine(nullptr)";
    }
    return debug;
}